

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dt-from-pseudo-root-dt.cpp
# Opt level: O0

Up __thiscall
yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoOptWithIntSelType
          (DtFromPseudoRootDtConverter *this,PseudoDt *pseudoDt)

{
  bool bVar1;
  uint uVar2;
  reference ppPVar3;
  RangeSet *pRVar4;
  unsigned_long_long lower;
  unsigned_long_long upper;
  PseudoOptWithIntSelType *in_RDX;
  pair<std::_Rb_tree_const_iterator<yactfr::IntegerRange<long_long,_true>_>,_bool> pVar5;
  undefined1 local_218 [56];
  IntegerRangeSet<long_long,_true> local_1e0;
  undefined1 local_1ac [12];
  _Base_ptr local_1a0;
  undefined1 local_198;
  IntegerRange<long_long,_true> local_190;
  IntegerRange<unsigned_long_long,_false> *local_180;
  IntegerRange<unsigned_long_long,_false> *range;
  const_iterator __end3;
  const_iterator __begin3;
  RangeSet *__range3;
  set<yactfr::IntegerRange<long_long,_true>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
  ranges;
  undefined1 local_128 [8];
  IntegerRangeSet<unsigned_long_long,_true> local_120;
  undefined1 local_ec [12];
  _Node_iterator_base<const_yactfr::internal::PseudoDt_*,_false> local_e0;
  PseudoDt *local_d8;
  undefined1 local_d0 [8];
  Up containedDt;
  unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
  *pseudoSelDts;
  DataLocation *selLoc;
  allocator local_a1;
  string local_a0;
  undefined1 local_80 [8];
  _tPseudoDtSels selLocPseudoDtsPair;
  PseudoOptWithIntSelType *pseudoOptType;
  PseudoDt *pseudoDt_local;
  DtFromPseudoRootDtConverter *this_local;
  
  uVar2 = PseudoTraceType::majorVersion((PseudoTraceType *)(pseudoDt->_loc)._lineNumber);
  if (uVar2 != 2) {
    __assert_fail("_pseudoTraceType->majorVersion() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/dt-from-pseudo-root-dt.cpp"
                  ,0x3ef,
                  "DataType::Up yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoOptWithIntSelType(const PseudoDt &)"
                 );
  }
  selLocPseudoDtsPair.second._M_h._M_single_bucket = (__node_base_ptr)in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"optional",&local_a1);
  _pseudoDtIntSels<yactfr::internal::PseudoOptWithIntSelType>
            ((_tPseudoDtSels *)local_80,(DtFromPseudoRootDtConverter *)pseudoDt,in_RDX,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  containedDt._M_t.
  super___uniq_ptr_impl<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>.
  super__Head_base<0UL,_const_yactfr::DataType_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
        )&selLocPseudoDtsPair.first._pathElems.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d8 = pseudoDt;
  _whileVisitingPseudoDt<yactfr::internal::PseudoOptWithIntSelType,yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoOptWithIntSelType(yactfr::internal::PseudoDt_const&)::__0>
            ((DtFromPseudoRootDtConverter *)local_d0,(PseudoOptWithIntSelType *)pseudoDt,
             (anon_class_8_1_8991fb9c *)selLocPseudoDtsPair.second._M_h._M_single_bucket);
  bVar1 = std::
          unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
          ::empty((unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
                   *)containedDt._M_t.
                     super___uniq_ptr_impl<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>
                     .super__Head_base<0UL,_const_yactfr::DataType_*,_false>._M_head_impl);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!pseudoSelDts.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/dt-from-pseudo-root-dt.cpp"
                  ,0x3fa,
                  "DataType::Up yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoOptWithIntSelType(const PseudoDt &)"
                 );
  }
  local_e0._M_cur =
       (__node_type *)
       std::
       unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
       ::begin((unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
                *)containedDt._M_t.
                  super___uniq_ptr_impl<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>
                  .super__Head_base<0UL,_const_yactfr::DataType_*,_false>._M_head_impl);
  ppPVar3 = std::__detail::_Node_const_iterator<const_yactfr::internal::PseudoDt_*,_true,_false>::
            operator*((_Node_const_iterator<const_yactfr::internal::PseudoDt_*,_true,_false> *)
                      &local_e0);
  uVar2 = (*(*ppPVar3)->_vptr_PseudoDt[7])();
  if ((uVar2 & 1) == 0) {
    std::
    set<yactfr::IntegerRange<long_long,_true>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
    ::set((set<yactfr::IntegerRange<long_long,_true>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
           *)&__range3);
    pRVar4 = PseudoOptWithIntSelType::selRanges
                       ((PseudoOptWithIntSelType *)selLocPseudoDtsPair.second._M_h._M_single_bucket)
    ;
    __end3 = IntegerRangeSet<unsigned_long_long,_false>::begin(pRVar4);
    range = (IntegerRange<unsigned_long_long,_false> *)
            IntegerRangeSet<unsigned_long_long,_false>::end(pRVar4);
    while( true ) {
      bVar1 = std::operator!=(&__end3,(_Self *)&range);
      if (!bVar1) break;
      local_180 = std::_Rb_tree_const_iterator<yactfr::IntegerRange<unsigned_long_long,_false>_>::
                  operator*(&__end3);
      lower = IntegerRange<unsigned_long_long,_false>::lower(local_180);
      upper = IntegerRange<unsigned_long_long,_false>::upper(local_180);
      IntegerRange<long_long,_true>::IntegerRange(&local_190,lower,upper);
      pVar5 = std::
              set<yactfr::IntegerRange<long_long,_true>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
              ::insert((set<yactfr::IntegerRange<long_long,_true>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
                        *)&__range3,&local_190);
      local_1a0 = (_Base_ptr)pVar5.first._M_node;
      local_198 = pVar5.second;
      std::_Rb_tree_const_iterator<yactfr::IntegerRange<unsigned_long_long,_false>_>::operator++
                (&__end3);
    }
    local_1ac._0_4_ = 1;
    std::
    set<yactfr::IntegerRange<long_long,_true>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
    ::set((set<yactfr::IntegerRange<long_long,_true>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
           *)(local_218 + 8),
          (set<yactfr::IntegerRange<long_long,_true>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
           *)&__range3);
    IntegerRangeSet<long_long,_true>::IntegerRangeSet
              (&local_1e0,
               (set<yactfr::IntegerRange<long_long,_true>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
                *)(local_218 + 8));
    WithAttrsMixin::attrs((WithAttrsMixin *)(selLocPseudoDtsPair.second._M_h._M_single_bucket + 6));
    tryCloneAttrs((MapItem *)local_218);
    OptionalWithSignedIntegerSelectorType::
    create<int,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::DataLocation,yactfr::IntegerRangeSet<long_long,true>,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
              ((int *)(local_1ac + 4),
               (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
               local_1ac,(DataLocation *)local_d0,(IntegerRangeSet<long_long,_true> *)local_80,
               (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &local_1e0);
    std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>::
    unique_ptr<yactfr::OptionalWithSignedIntegerSelectorType_const,std::default_delete<yactfr::OptionalWithSignedIntegerSelectorType_const>,void>
              ((unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>> *)
               this,(unique_ptr<const_yactfr::OptionalWithSignedIntegerSelectorType,_std::default_delete<const_yactfr::OptionalWithSignedIntegerSelectorType>_>
                     *)(local_1ac + 4));
    std::
    unique_ptr<const_yactfr::OptionalWithSignedIntegerSelectorType,_std::default_delete<const_yactfr::OptionalWithSignedIntegerSelectorType>_>
    ::~unique_ptr((unique_ptr<const_yactfr::OptionalWithSignedIntegerSelectorType,_std::default_delete<const_yactfr::OptionalWithSignedIntegerSelectorType>_>
                   *)(local_1ac + 4));
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               local_218);
    IntegerRangeSet<long_long,_true>::~IntegerRangeSet(&local_1e0);
    std::
    set<yactfr::IntegerRange<long_long,_true>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
    ::~set((set<yactfr::IntegerRange<long_long,_true>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
            *)(local_218 + 8));
    ranges._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
    std::
    set<yactfr::IntegerRange<long_long,_true>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
    ::~set((set<yactfr::IntegerRange<long_long,_true>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
            *)&__range3);
  }
  else {
    local_ec._0_4_ = 1;
    pRVar4 = PseudoOptWithIntSelType::selRanges
                       ((PseudoOptWithIntSelType *)selLocPseudoDtsPair.second._M_h._M_single_bucket)
    ;
    anon_unknown_24::uIntRangeSetFromUIntRangeSetWithoutPrecondsCheck
              ((IntegerRangeSet<unsigned_long_long,_true> *)(local_128 + 8),pRVar4);
    WithAttrsMixin::attrs((WithAttrsMixin *)(selLocPseudoDtsPair.second._M_h._M_single_bucket + 6));
    tryCloneAttrs((MapItem *)local_128);
    OptionalWithUnsignedIntegerSelectorType::
    create<int,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::DataLocation,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
              ((int *)(local_ec + 4),
               (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
               local_ec,(DataLocation *)local_d0,
               (IntegerRangeSet<unsigned_long_long,_true> *)local_80,
               (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               (local_128 + 8));
    std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>::
    unique_ptr<yactfr::OptionalWithUnsignedIntegerSelectorType_const,std::default_delete<yactfr::OptionalWithUnsignedIntegerSelectorType_const>,void>
              ((unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>> *)
               this,(unique_ptr<const_yactfr::OptionalWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::OptionalWithUnsignedIntegerSelectorType>_>
                     *)(local_ec + 4));
    std::
    unique_ptr<const_yactfr::OptionalWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::OptionalWithUnsignedIntegerSelectorType>_>
    ::~unique_ptr((unique_ptr<const_yactfr::OptionalWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::OptionalWithUnsignedIntegerSelectorType>_>
                   *)(local_ec + 4));
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               local_128);
    IntegerRangeSet<unsigned_long_long,_true>::~IntegerRangeSet
              ((IntegerRangeSet<unsigned_long_long,_true> *)(local_128 + 8));
    ranges._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
  }
  std::unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>::~unique_ptr
            ((unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
             local_d0);
  std::
  pair<yactfr::DataLocation,_std::unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>_>
  ::~pair((pair<yactfr::DataLocation,_std::unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>_>
           *)local_80);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up DtFromPseudoRootDtConverter::_dtFromPseudoOptWithIntSelType(const PseudoDt& pseudoDt)
{
    assert(_pseudoTraceType->majorVersion() == 2);

    auto& pseudoOptType = static_cast<const PseudoOptWithIntSelType&>(pseudoDt);
    auto selLocPseudoDtsPair = this->_pseudoDtIntSels(pseudoOptType, "optional");
    auto& selLoc = selLocPseudoDtsPair.first;
    const auto& pseudoSelDts = selLocPseudoDtsPair.second;

    auto containedDt = this->_whileVisitingPseudoDt(pseudoOptType, [this](auto& pseudoOptType) {
        return this->_dtFromPseudoDt(pseudoOptType.pseudoDt());
    });

    assert(!pseudoSelDts.empty());

    if ((*pseudoSelDts.begin())->isUInt()) {
        return OptionalWithUnsignedIntegerSelectorType::create(1, std::move(containedDt),
                                                               std::move(selLoc),
                                                               uIntRangeSetFromUIntRangeSetWithoutPrecondsCheck(pseudoOptType.selRanges()),
                                                               tryCloneAttrs(pseudoOptType.attrs()));
    } else {
        using SInt = long long;

        std::set<IntegerRange<SInt>> ranges;

        for (auto& range : pseudoOptType.selRanges()) {
            ranges.insert(IntegerRange<SInt> {
                static_cast<SInt>(range.lower()),
                static_cast<SInt>(range.upper())
            });
        }

        return OptionalWithSignedIntegerSelectorType::create(1, std::move(containedDt),
                                                             std::move(selLoc),
                                                             IntegerRangeSet<SInt> {std::move(ranges)},
                                                             tryCloneAttrs(pseudoOptType.attrs()));
    }

    return nullptr;
}